

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::RegisterOptionsByIp(DnsStats *this,uint8_t *source_addr,size_t source_addr_length)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t *puVar5;
  bool bVar6;
  StatsByIP *this_00;
  uint uVar7;
  bool stored;
  StatsByIP x;
  
  StatsByIP::StatsByIP(&x,source_addr,source_addr_length,false,false,false,false);
  this_00 = BinHash<StatsByIP>::Retrieve(&this->statsByIp,&x);
  if (this_00 == (StatsByIP *)0x0) {
    if (this->max_stats_by_ip_count <= (this->statsByIp).tableCount) goto LAB_00165094;
    stored = false;
    this_00 = BinHash<StatsByIP>::InsertOrAdd(&this->statsByIp,&x,true,&stored);
    if (this_00 == (StatsByIP *)0x0) goto LAB_00165094;
LAB_00165017:
    this_00->query_seen = true;
  }
  else if (this_00->query_seen == false) {
    this_00->count = this_00->count + 1;
    goto LAB_00165017;
  }
  if ((this->is_using_edns == true) && (this->edns_options != (uint8_t *)0x0)) {
    for (uVar7 = 0; uVar7 + 4 <= this->edns_options_length;
        uVar7 = uVar7 + 4 + (uint)CONCAT11(uVar3,uVar4)) {
      puVar5 = this->edns_options;
      uVar1 = puVar5[uVar7];
      uVar2 = puVar5[uVar7 + 1];
      uVar3 = puVar5[uVar7 + 2];
      uVar4 = puVar5[uVar7 + 3];
      bVar6 = StatsByIP::RegisterNewOption(this_00,CONCAT11(uVar1,uVar2));
      if (bVar6) {
        SubmitRegistryNumber(this,0x2d,(uint)CONCAT11(uVar1,uVar2));
      }
    }
  }
LAB_00165094:
  StatsByIP::~StatsByIP(&x);
  return;
}

Assistant:

void DnsStats::RegisterOptionsByIp(const uint8_t * source_addr, size_t source_addr_length)
{
    StatsByIP x(source_addr, source_addr_length, false, false, false, false);
    StatsByIP * y = statsByIp.Retrieve(&x);

    if (y == NULL) {
        if (statsByIp.GetCount() < max_stats_by_ip_count) {
            bool stored = false;

            if ((y = statsByIp.InsertOrAdd(&x, true, &stored)) != NULL) {
                y->query_seen = true;
            }
        }
    } else {
        if (!y->query_seen) {
            y->count++;
            y->query_seen = true;
        }
    }

    if (y != NULL && is_using_edns && edns_options != NULL) {
        /* Should export the EDNS Options to new table. */
        uint32_t current_index = 0;
        while (current_index + 4 <= edns_options_length)
        {
            uint16_t o_code = (edns_options[current_index] << 8) | edns_options[current_index + 1];
            uint16_t o_length = (edns_options[current_index + 2] << 8) | edns_options[current_index + 3];
            bool should_export = y->RegisterNewOption(o_code);

            if (should_export) {
                SubmitRegistryNumber(REGISTRY_EDNS_OPT_USAGE, o_code);
            }
            current_index += 4 + o_length;
        }
    }
}